

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_meta___index(lua_State *L)

{
  TValue *pTVar1;
  int iVar2;
  TValue *o;
  uint8_t *p;
  CType *ct;
  CTState *pCStack_30;
  CTInfo qual;
  CTState *cts;
  lua_State *L_local;
  CTState *local_18;
  CTState *cts_1;
  
  pCStack_30 = *(CTState **)((L->glref).ptr64 + 0x180);
  pCStack_30->L = L;
  ct._4_4_ = 0;
  pTVar1 = L->base;
  cts = (CTState *)L;
  local_18 = pCStack_30;
  cts_1 = (CTState *)L;
  if ((pTVar1 + 1 < L->top) && ((int)(pTVar1->field_4).it >> 0xf == -0xb)) {
    p = (uint8_t *)
        lj_cdata_index(pCStack_30,(GCcdata *)(pTVar1->u64 & 0x7fffffffffff),pTVar1 + 1,
                       (uint8_t **)&o,(CTInfo *)((long)&ct + 4));
    if ((ct._4_4_ & 1) == 0) {
      iVar2 = lj_cdata_get(pCStack_30,(CType *)p,(TValue *)&cts->miscmap[-1].freetop,
                           (uint8_t *)&o->u64);
      if ((iVar2 != 0) && ((cts->L->gclist).gcptr64 <= (cts->L->glref).ptr64)) {
        lj_gc_step((lua_State *)cts);
      }
      L_local._4_4_ = 1;
    }
    else {
      L_local._4_4_ = ffi_index_meta((lua_State *)cts,pCStack_30,(CType *)p,MM_index);
    }
    return L_local._4_4_;
  }
  lj_err_argt(L,1,10);
}

Assistant:

LJLIB_CF(ffi_meta___index)	LJLIB_REC(cdata_index 0)
{
  CTState *cts = ctype_cts(L);
  CTInfo qual = 0;
  CType *ct;
  uint8_t *p;
  TValue *o = L->base;
  if (!(o+1 < L->top && tviscdata(o)))  /* Also checks for presence of key. */
    lj_err_argt(L, 1, LUA_TCDATA);
  ct = lj_cdata_index(cts, cdataV(o), o+1, &p, &qual);
  if ((qual & 1))
    return ffi_index_meta(L, cts, ct, MM_index);
  if (lj_cdata_get(cts, ct, L->top-1, p))
    lj_gc_check(L);
  return 1;
}